

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

Status __thiscall
soplex::SPxSolverBase<double>::getBasis
          (SPxSolverBase<double> *this,VarStatus *row,VarStatus *col,int rowsSize,int colsSize)

{
  VarStatus VVar1;
  Status SVar2;
  long lVar3;
  ulong uVar4;
  
  if ((col != (VarStatus *)0x0) &&
     (lVar3 = (long)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                    super_SVSetBase<double>.set.thenum, 0 < lVar3)) {
    uVar4 = lVar3 + 1;
    do {
      VVar1 = basisStatusToVarStatus
                        (this,(this->super_SPxBasisBase<double>).thedesc.colstat.data[uVar4 - 2]);
      col[uVar4 - 2] = VVar1;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  if ((row != (VarStatus *)0x0) &&
     (lVar3 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                    super_SVSetBase<double>.set.thenum, 0 < lVar3)) {
    uVar4 = lVar3 + 1;
    do {
      VVar1 = basisStatusToVarStatus
                        (this,(this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar4 - 2]);
      row[uVar4 - 2] = VVar1;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  SVar2 = status(this);
  return SVar2;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getBasis(VarStatus row[], VarStatus col[],
         const int rowsSize, const int colsSize) const
   {
      const typename SPxBasisBase<R>::Desc& d = this->desc();
      int i;

      assert(rowsSize < 0 || rowsSize >= this->nRows());
      assert(colsSize < 0 || colsSize >= this->nCols());

      if(col)
         for(i = this->nCols() - 1; i >= 0; --i)
            col[i] = basisStatusToVarStatus(d.colStatus(i));

      if(row)
         for(i = this->nRows() - 1; i >= 0; --i)
            row[i] = basisStatusToVarStatus(d.rowStatus(i));

      return status();
   }